

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O1

BOOL DisableThreadLibraryCalls(HMODULE hLibModule)

{
  BOOL BVar1;
  
  if (PAL_InitializeChakraCoreCalled) {
    LockModuleList();
    if (terminator.m_val == 0) {
      BVar1 = LOADValidateModule((MODSTRUCT *)hLibModule);
      if (BVar1 == 0) {
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_0012dbeb;
      }
      else {
        *(undefined4 *)((long)hLibModule + 0x24) = 0;
      }
    }
    UnlockModuleList();
    if (PAL_InitializeChakraCoreCalled != false) {
      return 1;
    }
  }
LAB_0012dbeb:
  abort();
}

Assistant:

BOOL
PALAPI
DisableThreadLibraryCalls(
    IN HMODULE hLibModule)
{
    BOOL ret = FALSE;
    MODSTRUCT *module;
    PERF_ENTRY(DisableThreadLibraryCalls);
    ENTRY("DisableThreadLibraryCalls(hLibModule=%p)\n", hLibModule);

    LockModuleList();

    if (terminator)
    {
        /* PAL shutdown in progress - ignore DisableThreadLibraryCalls */
        ret = TRUE;
        goto done;
    }

    module = (MODSTRUCT *) hLibModule;

    if (!LOADValidateModule(module))
    {
        // DisableThreadLibraryCalls() does nothing when given
        // an invalid module handle. This matches the Windows
        // behavior, though it is counter to MSDN.
        WARN("Invalid module handle %p\n", hLibModule);
        ret = TRUE;
        goto done;
    }

    module->threadLibCalls = FALSE;
    ret = TRUE;

done:
    UnlockModuleList();
    LOGEXIT("DisableThreadLibraryCalls returns BOOL %d\n", ret);
    PERF_EXIT(DisableThreadLibraryCalls);
    return ret;
}